

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::ScaleTexture::readFrom(ScaleTexture *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  runtime_error *this_00;
  
  BinaryReader::read<pbrt::Texture>(binary,&this->tex1);
  BinaryReader::read<pbrt::Texture>(binary,&this->tex2);
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    (this->scale1).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->scale1).x = (float)(int)uVar3;
    (this->scale1).y = (float)(int)((ulong)uVar3 >> 0x20);
    sVar1 = binary->currentEntityOffset;
    binary->currentEntityOffset = sVar1 + 0xc;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar1 + 0x18 <=
        (ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2)) {
      (this->scale2).z = *(float *)(puVar2 + sVar1 + 0x14);
      uVar3 = *(undefined8 *)(puVar2 + sVar1 + 0xc);
      (this->scale2).x = (float)(int)uVar3;
      (this->scale2).y = (float)(int)((ulong)uVar3 >> 0x20);
      binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ScaleTexture::readFrom(BinaryReader &binary) 
  {
    Texture::readFrom(binary);
    binary.read(tex1);
    binary.read(tex2);
    binary.read(scale1);
    binary.read(scale2);
  }